

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void pq_ensure_unlinked(PacketQueueNode *node)

{
  PacketQueueNode *node_local;
  
  if ((node->on_free_queue & 1U) == 0) {
    if (node->next != (PacketQueueNode *)0x0) {
      __assert_fail("!node->next",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0x1b,"void pq_ensure_unlinked(PacketQueueNode *)");
    }
    if (node->prev != (PacketQueueNode *)0x0) {
      __assert_fail("!node->prev",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0x1c,"void pq_ensure_unlinked(PacketQueueNode *)");
    }
  }
  else {
    node->next->prev = node->prev;
    node->prev->next = node->next;
  }
  return;
}

Assistant:

static void pq_ensure_unlinked(PacketQueueNode *node)
{
    if (node->on_free_queue) {
        node->next->prev = node->prev;
        node->prev->next = node->next;
    } else {
        assert(!node->next);
        assert(!node->prev);
    }
}